

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_math.hpp
# Opt level: O2

double __thiscall
trng::int_math::power<2147462579,_1616076847>::pow
          (power<2147462579,_1616076847> *this,double __x,double __y)

{
  int32_t iVar1;
  uint in_ESI;
  long lVar2;
  long lVar3;
  double extraout_XMM0_Qa;
  
  lVar3 = 0x6053602f;
  lVar2 = 1;
  for (; 0 < (int)in_ESI; in_ESI = in_ESI >> 1) {
    if ((in_ESI & 1) != 0) {
      iVar1 = modulo_helper<2147462579,_0>::modulo(lVar2 * lVar3);
      lVar2 = (long)iVar1;
    }
    iVar1 = modulo_helper<2147462579,_0>::modulo(lVar3 * lVar3);
    lVar3 = (long)iVar1;
    __x = extraout_XMM0_Qa;
  }
  return __x;
}

Assistant:

int32_t pow(int32_t n) {
        int64_t p{1}, t{b};
        while (n > 0) {
          if ((n & 0x1) == 0x1)
            p = modulo<m, 1>(p * t);
          t = modulo<m, 1>(t * t);
          n /= 2;
        }
        return static_cast<int32_t>(p);
      }